

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThreads.cpp
# Opt level: O0

Value __thiscall xmrig::OclThreads::toJSON(OclThreads *this,Document *doc)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Value VVar2;
  OclThread *thread;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *__range1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  OclThread *in_stack_00000088;
  undefined4 in_stack_ffffffffffffff78;
  Type in_stack_ffffffffffffff7c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_68;
  reference local_58;
  OclThread *local_50;
  __normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
  local_48 [4];
  undefined1 local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_RDI,in_stack_ffffffffffffff7c);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  SetArray(in_RDI);
  local_48[0]._M_current =
       (OclThread *)
       std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::begin
                 ((vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_50 = (OclThread *)
             std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::end
                       ((vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1
        ) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
               ::operator*(local_48);
    OclThread::toJSON(in_stack_00000088,(Document *)out);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(in_RDI,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x2151d5);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_68);
    __gnu_cxx::
    __normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
    ::operator++(local_48);
  }
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::OclThreads::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kArrayType);

    out.SetArray();

    for (const OclThread &thread : m_data) {
        out.PushBack(thread.toJSON(doc), allocator);
    }

    return out;
}